

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opengl3.cpp
# Opt level: O2

void ImGui_ImplOpenGL3_RenderDrawData(ImDrawData *draw_data)

{
  undefined4 uVar1;
  ImVec2 IVar2;
  ImVec2 IVar3;
  undefined4 uVar4;
  ImDrawList *this;
  ImDrawCallback p_Var5;
  undefined1 auVar6 [16];
  void *pvVar7;
  float fb_width;
  float fb_height;
  GLboolean GVar8;
  GLboolean GVar9;
  GLboolean GVar10;
  GLboolean GVar11;
  undefined4 in_EAX;
  int iVar12;
  uint uVar13;
  ImDrawCmd *pIVar14;
  PFNGLENABLEPROC *pp_Var15;
  long lVar16;
  int cmd_i;
  PFNGLENABLEPROC *pp_Var17;
  int iVar18;
  float fVar19;
  float fVar21;
  undefined1 auVar20 [16];
  float fVar22;
  float fVar23;
  float fVar24;
  GLuint vertex_array_object;
  GLenum last_blend_equation_alpha;
  GLenum last_blend_equation_rgb;
  GLenum last_blend_dst_alpha;
  GLenum last_blend_src_alpha;
  GLenum last_blend_dst_rgb;
  GLenum last_blend_src_rgb;
  GLint last_vertex_array_object;
  GLint last_array_buffer;
  GLint last_sampler;
  GLint last_texture;
  GLint last_program;
  GLenum last_active_texture;
  float local_c8;
  float fStack_c4;
  float fStack_c0;
  float fStack_bc;
  float local_b8;
  float fStack_b4;
  undefined8 uStack_b0;
  GLint last_scissor_box [4];
  GLint last_viewport [4];
  GLint last_polygon_mode [2];
  float local_78;
  float local_68;
  
  local_b8 = (float)(int)((draw_data->FramebufferScale).x * (draw_data->DisplaySize).x);
  fStack_b4 = (float)(int)((draw_data->FramebufferScale).y * (draw_data->DisplaySize).y);
  auVar20._0_4_ = -(uint)(0 < (int)local_b8);
  auVar20._4_4_ = -(uint)(0 < (int)local_b8);
  auVar20._8_4_ = -(uint)(0 < (int)fStack_b4);
  auVar20._12_4_ = -(uint)(0 < (int)fStack_b4);
  iVar12 = movmskpd(in_EAX,auVar20);
  if (iVar12 == 3) {
    uStack_b0 = 0;
    (*glad_glGetIntegerv)(0x84e0,(GLint *)&last_active_texture);
    (*glad_glActiveTexture)(0x84c0);
    (*glad_glGetIntegerv)(0x8b8d,&last_program);
    (*glad_glGetIntegerv)(0x8069,&last_texture);
    (*glad_glGetIntegerv)(0x8919,&last_sampler);
    (*glad_glGetIntegerv)(0x8894,&last_array_buffer);
    (*glad_glGetIntegerv)(0x85b5,&last_vertex_array_object);
    (*glad_glGetIntegerv)(0xb40,last_polygon_mode);
    (*glad_glGetIntegerv)(0xba2,last_viewport);
    (*glad_glGetIntegerv)(0xc10,last_scissor_box);
    (*glad_glGetIntegerv)(0x80c9,(GLint *)&last_blend_src_rgb);
    (*glad_glGetIntegerv)(0x80c8,(GLint *)&last_blend_dst_rgb);
    (*glad_glGetIntegerv)(0x80cb,(GLint *)&last_blend_src_alpha);
    (*glad_glGetIntegerv)(0x80ca,(GLint *)&last_blend_dst_alpha);
    (*glad_glGetIntegerv)(0x8009,(GLint *)&last_blend_equation_rgb);
    (*glad_glGetIntegerv)(0x883d,(GLint *)&last_blend_equation_alpha);
    GVar8 = (*glad_glIsEnabled)(0xbe2);
    GVar9 = (*glad_glIsEnabled)(0xb44);
    GVar10 = (*glad_glIsEnabled)(0xb71);
    GVar11 = (*glad_glIsEnabled)(0xc11);
    vertex_array_object = 0;
    (*glad_glGenVertexArrays)(1,&vertex_array_object);
    fb_height = fStack_b4;
    fb_width = local_b8;
    local_c8 = fStack_b4;
    fStack_c4 = fStack_b4;
    fStack_c0 = fStack_b4;
    fStack_bc = fStack_b4;
    ImGui_ImplOpenGL3_SetupRenderState(draw_data,(int)local_b8,(int)fStack_b4,vertex_array_object);
    IVar2 = draw_data->DisplayPos;
    IVar3 = draw_data->FramebufferScale;
    fVar23 = IVar3.y;
    fVar21 = IVar2.y;
    _local_b8 = CONCAT44((float)(int)fStack_b4,(float)(int)local_b8);
    uStack_b0 = CONCAT44((float)uStack_b0._4_4_,(float)(int)uStack_b0);
    local_c8 = (float)(int)local_c8;
    fStack_c4 = (float)(int)fStack_c4;
    fStack_c0 = (float)(int)fStack_c0;
    fStack_bc = (float)(int)fStack_bc;
    for (lVar16 = 0; lVar16 < draw_data->CmdListsCount; lVar16 = lVar16 + 1) {
      this = draw_data->CmdLists[lVar16];
      (*glad_glBufferData)(0x8892,(long)(this->VtxBuffer).Size * 0x14,(this->VtxBuffer).Data,0x88e0)
      ;
      (*glad_glBufferData)(0x8893,(long)(this->IdxBuffer).Size * 2,(this->IdxBuffer).Data,0x88e0);
      for (iVar12 = 0; iVar12 < (this->CmdBuffer).Size; iVar12 = iVar12 + 1) {
        pIVar14 = ImVector<ImDrawCmd>::operator[](&this->CmdBuffer,iVar12);
        p_Var5 = pIVar14->UserCallback;
        if (p_Var5 == (ImDrawCallback)0x0) {
          local_68 = IVar2.x;
          local_78 = IVar3.x;
          fVar19 = ((pIVar14->ClipRect).x - local_68) * local_78;
          if ((fVar19 < local_b8) &&
             (fVar22 = ((pIVar14->ClipRect).y - fVar21) * fVar23, fVar22 < local_c8)) {
            uVar1 = (pIVar14->ClipRect).z;
            uVar4 = (pIVar14->ClipRect).w;
            local_78 = ((float)uVar1 - local_68) * local_78;
            fVar24 = ((float)uVar4 - fVar21) * fVar23;
            iVar18 = -(uint)(0.0 <= local_78);
            auVar6._4_4_ = iVar18;
            auVar6._0_4_ = iVar18;
            auVar6._8_4_ = -(uint)(0.0 <= fVar24);
            auVar6._12_4_ = -(uint)(0.0 <= fVar24);
            uVar13 = movmskpd(0,auVar6);
            if (((uVar13 & 1) != 0) && ((byte)((byte)uVar13 >> 1) != 0)) {
              (*glad_glScissor)((int)fVar19,(int)(local_c8 - fVar24),(int)(local_78 - fVar19),
                                (int)(fVar24 - fVar22));
              (*glad_glBindTexture)(0xde1,*(GLuint *)&pIVar14->TextureId);
              pvVar7 = (void *)((ulong)pIVar14->IdxOffset * 2);
              if (g_GlVersion < 0x140) {
                (*glad_glDrawElements)(4,pIVar14->ElemCount,0x1403,pvVar7);
              }
              else {
                (*glad_glDrawElementsBaseVertex)
                          (4,pIVar14->ElemCount,0x1403,pvVar7,pIVar14->VtxOffset);
              }
            }
          }
        }
        else if (p_Var5 == (ImDrawCallback)0xffffffffffffffff) {
          ImGui_ImplOpenGL3_SetupRenderState
                    (draw_data,(int)fb_width,(int)fb_height,vertex_array_object);
        }
        else {
          (*p_Var5)(this,pIVar14);
        }
      }
    }
    (*glad_glDeleteVertexArrays)(1,&vertex_array_object);
    (*glad_glUseProgram)(last_program);
    (*glad_glBindTexture)(0xde1,last_texture);
    (*glad_glBindSampler)(0,last_sampler);
    (*glad_glActiveTexture)(last_active_texture);
    (*glad_glBindVertexArray)(last_vertex_array_object);
    (*glad_glBindBuffer)(0x8892,last_array_buffer);
    (*glad_glBlendEquationSeparate)(last_blend_equation_rgb,last_blend_equation_alpha);
    (*glad_glBlendFuncSeparate)
              (last_blend_src_rgb,last_blend_dst_rgb,last_blend_src_alpha,last_blend_dst_alpha);
    pp_Var17 = &glad_glEnable;
    pp_Var15 = &glad_glEnable;
    if (GVar8 == '\0') {
      pp_Var15 = &glad_glDisable;
    }
    (**pp_Var15)(0xbe2);
    pp_Var15 = &glad_glEnable;
    if (GVar9 == '\0') {
      pp_Var15 = &glad_glDisable;
    }
    (**pp_Var15)(0xb44);
    pp_Var15 = &glad_glEnable;
    if (GVar10 == '\0') {
      pp_Var15 = &glad_glDisable;
    }
    (**pp_Var15)(0xb71);
    if (GVar11 == '\0') {
      pp_Var17 = &glad_glDisable;
    }
    (**pp_Var17)(0xc11);
    (*glad_glPolygonMode)(0x408,last_polygon_mode[0]);
    (*glad_glViewport)(last_viewport[0],last_viewport[1],last_viewport[2],last_viewport[3]);
    (*glad_glScissor)(last_scissor_box[0],last_scissor_box[1],last_scissor_box[2],
                      last_scissor_box[3]);
  }
  return;
}

Assistant:

void    ImGui_ImplOpenGL3_RenderDrawData(ImDrawData* draw_data)
{
    // Avoid rendering when minimized, scale coordinates for retina displays (screen coordinates != framebuffer coordinates)
    int fb_width = (int)(draw_data->DisplaySize.x * draw_data->FramebufferScale.x);
    int fb_height = (int)(draw_data->DisplaySize.y * draw_data->FramebufferScale.y);
    if (fb_width <= 0 || fb_height <= 0)
        return;

    // Backup GL state
    GLenum last_active_texture; glGetIntegerv(GL_ACTIVE_TEXTURE, (GLint*)&last_active_texture);
    glActiveTexture(GL_TEXTURE0);
    GLint last_program; glGetIntegerv(GL_CURRENT_PROGRAM, &last_program);
    GLint last_texture; glGetIntegerv(GL_TEXTURE_BINDING_2D, &last_texture);
#ifdef GL_SAMPLER_BINDING
    GLint last_sampler; glGetIntegerv(GL_SAMPLER_BINDING, &last_sampler);
#endif
    GLint last_array_buffer; glGetIntegerv(GL_ARRAY_BUFFER_BINDING, &last_array_buffer);
#ifndef IMGUI_IMPL_OPENGL_ES2
    GLint last_vertex_array_object; glGetIntegerv(GL_VERTEX_ARRAY_BINDING, &last_vertex_array_object);
#endif
#ifdef GL_POLYGON_MODE
    GLint last_polygon_mode[2]; glGetIntegerv(GL_POLYGON_MODE, last_polygon_mode);
#endif
    GLint last_viewport[4]; glGetIntegerv(GL_VIEWPORT, last_viewport);
    GLint last_scissor_box[4]; glGetIntegerv(GL_SCISSOR_BOX, last_scissor_box);
    GLenum last_blend_src_rgb; glGetIntegerv(GL_BLEND_SRC_RGB, (GLint*)&last_blend_src_rgb);
    GLenum last_blend_dst_rgb; glGetIntegerv(GL_BLEND_DST_RGB, (GLint*)&last_blend_dst_rgb);
    GLenum last_blend_src_alpha; glGetIntegerv(GL_BLEND_SRC_ALPHA, (GLint*)&last_blend_src_alpha);
    GLenum last_blend_dst_alpha; glGetIntegerv(GL_BLEND_DST_ALPHA, (GLint*)&last_blend_dst_alpha);
    GLenum last_blend_equation_rgb; glGetIntegerv(GL_BLEND_EQUATION_RGB, (GLint*)&last_blend_equation_rgb);
    GLenum last_blend_equation_alpha; glGetIntegerv(GL_BLEND_EQUATION_ALPHA, (GLint*)&last_blend_equation_alpha);
    GLboolean last_enable_blend = glIsEnabled(GL_BLEND);
    GLboolean last_enable_cull_face = glIsEnabled(GL_CULL_FACE);
    GLboolean last_enable_depth_test = glIsEnabled(GL_DEPTH_TEST);
    GLboolean last_enable_scissor_test = glIsEnabled(GL_SCISSOR_TEST);

    // Setup desired GL state
    // Recreate the VAO every time (this is to easily allow multiple GL contexts to be rendered to. VAO are not shared among GL contexts)
    // The renderer would actually work without any VAO bound, but then our VertexAttrib calls would overwrite the default one currently bound.
    GLuint vertex_array_object = 0;
#ifndef IMGUI_IMPL_OPENGL_ES2
    glGenVertexArrays(1, &vertex_array_object);
#endif
    ImGui_ImplOpenGL3_SetupRenderState(draw_data, fb_width, fb_height, vertex_array_object);

    // Will project scissor/clipping rectangles into framebuffer space
    ImVec2 clip_off = draw_data->DisplayPos;         // (0,0) unless using multi-viewports
    ImVec2 clip_scale = draw_data->FramebufferScale; // (1,1) unless using retina display which are often (2,2)

    // Render command lists
    for (int n = 0; n < draw_data->CmdListsCount; n++)
    {
        const ImDrawList* cmd_list = draw_data->CmdLists[n];

        // Upload vertex/index buffers
        glBufferData(GL_ARRAY_BUFFER, (GLsizeiptr)cmd_list->VtxBuffer.Size * sizeof(ImDrawVert), (const GLvoid*)cmd_list->VtxBuffer.Data, GL_STREAM_DRAW);
        glBufferData(GL_ELEMENT_ARRAY_BUFFER, (GLsizeiptr)cmd_list->IdxBuffer.Size * sizeof(ImDrawIdx), (const GLvoid*)cmd_list->IdxBuffer.Data, GL_STREAM_DRAW);

        for (int cmd_i = 0; cmd_i < cmd_list->CmdBuffer.Size; cmd_i++)
        {
            const ImDrawCmd* pcmd = &cmd_list->CmdBuffer[cmd_i];
            if (pcmd->UserCallback != NULL)
            {
                // User callback, registered via ImDrawList::AddCallback()
                // (ImDrawCallback_ResetRenderState is a special callback value used by the user to request the renderer to reset render state.)
                if (pcmd->UserCallback == ImDrawCallback_ResetRenderState)
                    ImGui_ImplOpenGL3_SetupRenderState(draw_data, fb_width, fb_height, vertex_array_object);
                else
                    pcmd->UserCallback(cmd_list, pcmd);
            }
            else
            {
                // Project scissor/clipping rectangles into framebuffer space
                ImVec4 clip_rect;
                clip_rect.x = (pcmd->ClipRect.x - clip_off.x) * clip_scale.x;
                clip_rect.y = (pcmd->ClipRect.y - clip_off.y) * clip_scale.y;
                clip_rect.z = (pcmd->ClipRect.z - clip_off.x) * clip_scale.x;
                clip_rect.w = (pcmd->ClipRect.w - clip_off.y) * clip_scale.y;

                if (clip_rect.x < fb_width && clip_rect.y < fb_height && clip_rect.z >= 0.0f && clip_rect.w >= 0.0f)
                {
                    // Apply scissor/clipping rectangle
                    glScissor((int)clip_rect.x, (int)(fb_height - clip_rect.w), (int)(clip_rect.z - clip_rect.x), (int)(clip_rect.w - clip_rect.y));

                    // Bind texture, Draw
                    glBindTexture(GL_TEXTURE_2D, (GLuint)(intptr_t)pcmd->TextureId);
#if IMGUI_IMPL_OPENGL_MAY_HAVE_VTX_OFFSET
                    if (g_GlVersion >= 320)
                        glDrawElementsBaseVertex(GL_TRIANGLES, (GLsizei)pcmd->ElemCount, sizeof(ImDrawIdx) == 2 ? GL_UNSIGNED_SHORT : GL_UNSIGNED_INT, (void*)(intptr_t)(pcmd->IdxOffset * sizeof(ImDrawIdx)), (GLint)pcmd->VtxOffset);
                    else
#endif
                    glDrawElements(GL_TRIANGLES, (GLsizei)pcmd->ElemCount, sizeof(ImDrawIdx) == 2 ? GL_UNSIGNED_SHORT : GL_UNSIGNED_INT, (void*)(intptr_t)(pcmd->IdxOffset * sizeof(ImDrawIdx)));
                }
            }
        }
    }

    // Destroy the temporary VAO
#ifndef IMGUI_IMPL_OPENGL_ES2
    glDeleteVertexArrays(1, &vertex_array_object);
#endif

    // Restore modified GL state
    glUseProgram(last_program);
    glBindTexture(GL_TEXTURE_2D, last_texture);
#ifdef GL_SAMPLER_BINDING
    glBindSampler(0, last_sampler);
#endif
    glActiveTexture(last_active_texture);
#ifndef IMGUI_IMPL_OPENGL_ES2
    glBindVertexArray(last_vertex_array_object);
#endif
    glBindBuffer(GL_ARRAY_BUFFER, last_array_buffer);
    glBlendEquationSeparate(last_blend_equation_rgb, last_blend_equation_alpha);
    glBlendFuncSeparate(last_blend_src_rgb, last_blend_dst_rgb, last_blend_src_alpha, last_blend_dst_alpha);
    if (last_enable_blend) glEnable(GL_BLEND); else glDisable(GL_BLEND);
    if (last_enable_cull_face) glEnable(GL_CULL_FACE); else glDisable(GL_CULL_FACE);
    if (last_enable_depth_test) glEnable(GL_DEPTH_TEST); else glDisable(GL_DEPTH_TEST);
    if (last_enable_scissor_test) glEnable(GL_SCISSOR_TEST); else glDisable(GL_SCISSOR_TEST);
#ifdef GL_POLYGON_MODE
    glPolygonMode(GL_FRONT_AND_BACK, (GLenum)last_polygon_mode[0]);
#endif
    glViewport(last_viewport[0], last_viewport[1], (GLsizei)last_viewport[2], (GLsizei)last_viewport[3]);
    glScissor(last_scissor_box[0], last_scissor_box[1], (GLsizei)last_scissor_box[2], (GLsizei)last_scissor_box[3]);
}